

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  char cVar2;
  int iVar5;
  result rVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  size_t __len;
  ulong uVar12;
  fixed_handler handler;
  uint local_58;
  longdouble local_54;
  fixed_handler local_48;
  char cVar3;
  char cVar4;
  
  uVar11 = (ulong)(uint)precision;
  uVar12 = (ulong)specs & 0xff00000000;
  local_54 = value;
  if (value <= (longdouble)0) {
    if (0 < precision && uVar12 == 0x200000000) {
      if (buf->capacity_ < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
      }
      buf->size_ = uVar11;
      memset(buf->ptr_,0x30,uVar11);
      return -precision;
    }
    sVar8 = buf->size_;
    uVar11 = sVar8 + 1;
    if (buf->capacity_ < uVar11) {
      (**buf->_vptr_buffer)(buf);
      sVar8 = buf->size_;
      uVar11 = sVar8 + 1;
    }
    buf->size_ = uVar11;
    buf->ptr_[sVar8] = '0';
    return 0;
  }
  if (((ulong)specs >> 0x34 & 1) == 0) {
    iVar5 = snprintf_float<long_double>(value,precision,specs,buf);
    return iVar5;
  }
  if (precision < 0) {
    uVar12 = 0x26604b7a84467;
    local_48.buf = buf->ptr_;
    local_48.size = 0;
    local_48.exp10 = -0x4857bb99;
    local_48.fixed = true;
    local_48._21_3_ = 0x465e66;
    uVar11 = 0x1197;
    local_58 = 4;
    do {
      cVar3 = '\0';
      cVar2 = '\0';
      cVar4 = '\0';
      local_58 = local_58 - 1;
      switch((ulong)local_58) {
      case 0:
        cVar2 = (char)uVar11;
        uVar11 = 0;
        goto switchD_00170ab7_default;
      case 1:
        cVar2 = (char)(uVar11 / 10);
        iVar5 = (int)(uVar11 / 10) * 10;
        break;
      case 2:
        cVar2 = (char)(uVar11 / 100);
        iVar5 = (int)(uVar11 / 100) * 100;
        break;
      case 3:
        cVar2 = (char)(uVar11 / 1000);
        iVar5 = (int)(uVar11 / 1000) * 1000;
        break;
      case 4:
        iVar5 = (int)(uVar11 / 10000) * 10000;
        cVar2 = cVar4;
        break;
      case 5:
        iVar5 = (int)(uVar11 / 100000) * 100000;
        cVar2 = cVar4;
        break;
      case 6:
        iVar5 = (int)(uVar11 / 1000000) * 1000000;
        cVar2 = cVar4;
        break;
      case 7:
        iVar5 = (int)(uVar11 / 10000000) * 10000000;
        cVar2 = cVar3;
        break;
      case 8:
        iVar5 = (int)(uVar11 / 100000000) * 100000000;
        cVar2 = cVar3;
        break;
      case 9:
        iVar5 = (uint)((uVar11 >> 9) * 0x44b83 >> 0x27) * 1000000000;
        cVar2 = cVar3;
        break;
      default:
        goto switchD_00170ab7_default;
      }
      uVar11 = (ulong)(uint)((int)uVar11 - iVar5);
switchD_00170ab7_default:
      rVar6 = grisu_shortest_handler::on_digit
                        ((grisu_shortest_handler *)&local_48,cVar2 + '0',
                         (&basic_data<void>::powers_of_10_64)[local_58] << 0x32,
                         uVar11 << 0x32 | 0x26604b7a84467,2,local_58,true);
      if (rVar6 != more) goto LAB_00170c3f;
    } while (0 < (int)local_58);
    uVar10 = 2;
    do {
      uVar11 = uVar12 * 10;
      uVar10 = uVar10 * 10;
      uVar12 = uVar11 & 0x3fffffffffffe;
      local_58 = local_58 - 1;
      rVar6 = grisu_shortest_handler::on_digit
                        ((grisu_shortest_handler *)&local_48,(byte)(uVar11 >> 0x32) | 0x30,
                         0x4000000000000,uVar12,uVar10,local_58,false);
    } while (rVar6 == more);
LAB_00170c3f:
    uVar11 = (ulong)(uint)local_48.size;
    if (rVar6 == error) {
      local_58 = local_58 + local_48.size + 0xb;
      fallback_format<long_double>(local_54,buf,(int *)&local_58);
      return local_58;
    }
LAB_00170caf:
    if (buf->capacity_ < uVar11) {
      (**buf->_vptr_buffer)(buf,uVar11);
    }
    buf->size_ = uVar11;
    iVar5 = local_58 + 0xc;
  }
  else {
    if ((uint)precision < 0x12) {
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.fixed = uVar12 == 0x200000000;
      local_48.exp10 = 0xc;
      local_58 = 1;
      local_48.precision = precision;
      rVar6 = fixed_handler::on_start(&local_48,0x4000000000000,0,10,(int *)&local_58);
      if (rVar6 == more) {
        do {
          uVar9 = local_58 - 1;
          lVar7 = (long)(int)local_58;
          local_58 = uVar9;
          rVar6 = fixed_handler::on_digit
                            (&local_48,'0',
                             *(long *)(
                                      "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                      + lVar7 * 8 + 0x18) << 0x32,0,1,uVar9,true);
          if (rVar6 != more) goto LAB_00170a05;
        } while (0 < (int)local_58);
        uVar10 = 1;
        do {
          uVar10 = uVar10 * 10;
          local_58 = local_58 - 1;
          rVar6 = fixed_handler::on_digit(&local_48,'0',0x4000000000000,0,uVar10,local_58,false);
        } while (rVar6 == more);
      }
LAB_00170a05:
      if (rVar6 != error) {
        uVar11 = (ulong)(uint)local_48.size;
        if (0 < local_48.size && uVar12 != 0x200000000) {
          uVar11 = (ulong)(uint)local_48.size;
          do {
            uVar9 = local_58 + 1;
            if (buf->ptr_[uVar11 - 1] != '0') goto LAB_00170cac;
            bVar1 = 1 < uVar11;
            uVar11 = uVar11 - 1;
            local_58 = uVar9;
          } while (bVar1);
          uVar11 = 0;
        }
LAB_00170cac:
        uVar11 = uVar11 & 0xffffffff;
        goto LAB_00170caf;
      }
    }
    iVar5 = snprintf_float<long_double>(local_54,precision,specs,buf);
  }
  return iVar5;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}